

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall Js::ByteCodeWriter::Data::SlowWrite(Data *this,void *data,uint byteSize)

{
  DataChunk *pDVar1;
  byte *pbVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  DataChunk *pDVar8;
  ulong count;
  
  uVar5 = DataChunk::RemainingBytes(this->current);
  if (byteSize <= uVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xd83,"(byteSize > current->RemainingBytes())",
                                "We should not need an extension if there is enough space in the current chunk"
                               );
    if (!bVar4) goto LAB_00897826;
    *puVar7 = 0;
  }
  pDVar8 = this->current;
  pDVar1 = pDVar8->nextChunk;
  if (pDVar1 != (DataChunk *)0x0) {
    pDVar1->currentByte = pDVar1->buffer;
  }
  uVar5 = DataChunk::RemainingBytes(pDVar8);
  if (uVar5 < byteSize) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pDVar8 = this->current;
      uVar6 = DataChunk::RemainingBytes(pDVar8);
      if (uVar6 < uVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeWriter.h"
                                    ,0x3a,"(RemainingBytes() >= byteSize)",
                                    "We do not have enough room");
        if (!bVar4) goto LAB_00897826;
        *puVar7 = 0;
      }
      pbVar2 = pDVar8->currentByte;
      uVar6 = DataChunk::RemainingBytes(pDVar8);
      count = (ulong)uVar5;
      js_memcpy_s(pbVar2,(ulong)uVar6,data,count);
      pDVar8->currentByte = pDVar8->currentByte + count;
      byteSize = byteSize - uVar5;
      pDVar8 = this->current->nextChunk;
      if (pDVar8 == (DataChunk *)0x0) {
        AddChunk(this,byteSize);
        pDVar8 = this->current->nextChunk;
      }
      data = (void *)((long)data + count);
      this->current = pDVar8;
      uVar5 = DataChunk::RemainingBytes(pDVar8);
    } while (uVar5 < byteSize);
  }
  pDVar8 = this->current;
  uVar5 = DataChunk::RemainingBytes(pDVar8);
  if (uVar5 < byteSize) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeWriter.h"
                                ,0x3a,"(RemainingBytes() >= byteSize)","We do not have enough room")
    ;
    if (!bVar4) {
LAB_00897826:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  pbVar2 = pDVar8->currentByte;
  uVar5 = DataChunk::RemainingBytes(pDVar8);
  js_memcpy_s(pbVar2,(ulong)uVar5,data,(ulong)byteSize);
  pDVar8->currentByte = pDVar8->currentByte + byteSize;
  return;
}

Assistant:

_NOINLINE void ByteCodeWriter::Data::SlowWrite(__in_bcount(byteSize) const void* data, __in uint byteSize)
    {
        AssertMsg(byteSize > current->RemainingBytes(), "We should not need an extension if there is enough space in the current chunk");
        uint bytesLeftToWrite = byteSize;
        byte* dataToBeWritten = (byte*)data;
        // the next chunk may already be created in the case that we are patching bytecode.
        // If so, we want to move the pointer to the beginning of the buffer
        if (current->nextChunk)
        {
            current->nextChunk->SetCurrentOffset(0);
        }
        while (true)
        {
            uint bytesFree = current->RemainingBytes();
            if (bytesFree >= bytesLeftToWrite)
            {
                current->WriteUnsafe(dataToBeWritten, bytesLeftToWrite);
                break;
            }

            current->WriteUnsafe(dataToBeWritten, bytesFree);
            bytesLeftToWrite -= bytesFree;
            dataToBeWritten += bytesFree;

            // Create a new chunk when needed
            if (!current->nextChunk)
            {
                AddChunk(bytesLeftToWrite);
            }
            current = current->nextChunk;
        }
    }